

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_dns.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 *userdata;
  N_Vector yy;
  N_Vector yd;
  N_Vector resval;
  long *returnvalue;
  void *returnvalue_00;
  int iVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  int retval;
  SUNContext ctx;
  void *local_98;
  double local_90;
  int local_84;
  void *local_80;
  sunrealtype time;
  void *local_70;
  long ncfn;
  long netf;
  long nre;
  long nje;
  long nni;
  long nst;
  long nreLS;
  
  retval = SUNContext_Create(0,&ctx);
  iVar3 = 1;
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    userdata = (undefined8 *)malloc(0x48);
    *userdata = 0x4032b33333333333;
    userdata[1] = 0x3fe28f5c28f5c28f;
    userdata[2] = 0x3fb70a3d70a3d70a;
    userdata[3] = 0x3fdae147ae147ae1;
    userdata[4] = 0x4041333333333333;
    userdata[5] = 0x400a666666666666;
    *(undefined4 *)(userdata + 6) = 0xb851eb85;
    *(undefined4 *)((long)userdata + 0x34) = 0x405cf51e;
    *(undefined4 *)(userdata + 7) = 0xcccccccd;
    *(undefined4 *)((long)userdata + 0x3c) = 0x3feccccc;
    userdata[8] = 0x4087080000000000;
    yy = (N_Vector)N_VNew_Serial(6,ctx);
    iVar2 = check_retval(yy,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      yd = (N_Vector)N_VClone(yy);
      iVar2 = check_retval(yd,"N_VNew_Serial",0);
      if (iVar2 == 0) {
        puVar1 = *(undefined8 **)((long)yy->content + 0x10);
        *puVar1 = 0x3fdc6a7ef9db22d1;
        puVar1[1] = 0x3f5426fe718a86d7;
        *(undefined4 *)(puVar1 + 2) = 0;
        *(undefined4 *)((long)puVar1 + 0x14) = 0;
        *(undefined4 *)(puVar1 + 3) = 0x3126e979;
        *(undefined4 *)((long)puVar1 + 0x1c) = 0x3f7cac08;
        *(undefined4 *)(puVar1 + 4) = 0;
        *(undefined4 *)((long)puVar1 + 0x24) = 0;
        *(undefined4 *)(puVar1 + 5) = 0xee17cb23;
        *(undefined4 *)((long)puVar1 + 0x2c) = 0x3fd70a3b;
        N_VConst(0,yd);
        resval = (N_Vector)N_VClone(yy);
        res((sunrealtype)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),yy,yd,resval,userdata);
        N_VScale(0,resval,yd);
        N_VDestroy(resval);
        returnvalue = (long *)N_VNew_Serial(1,ctx);
        iVar2 = check_retval(returnvalue,"N_VNew_Serial",0);
        if (iVar2 == 0) {
          **(undefined8 **)(*returnvalue + 0x10) = 0;
          returnvalue_00 = (void *)IDACreate(ctx);
          local_70 = returnvalue_00;
          iVar2 = check_retval(returnvalue_00,"IDACreate",0);
          if (iVar2 == 0) {
            retval = IDAInit(0,returnvalue_00,res,yy,yd);
            iVar3 = 1;
            iVar2 = check_retval(&retval,"IDAInit",1);
            if (iVar2 == 0) {
              local_90 = 1e-08;
              retval = IDASStolerances(0xe2308c3a,0xd9d7bdbb,returnvalue_00);
              iVar3 = 1;
              iVar2 = check_retval(&retval,"IDASStolerances",1);
              if (iVar2 == 0) {
                retval = IDASetUserData(returnvalue_00,userdata);
                iVar3 = 1;
                iVar2 = check_retval(&retval,"IDASetUserData",1);
                if (iVar2 == 0) {
                  local_98 = (void *)SUNDenseMatrix(6,6,ctx);
                  iVar2 = check_retval(local_98,"SUNDenseMatrix",0);
                  if (iVar2 == 0) {
                    local_80 = (void *)SUNLinSol_Dense(yy,local_98,ctx);
                    iVar2 = check_retval(local_80,"SUNLinSol_Dense",0);
                    if (iVar2 == 0) {
                      retval = IDASetLinearSolver(returnvalue_00,local_80,local_98);
                      iVar3 = 1;
                      iVar2 = check_retval(&retval,"IDASetLinearSolver",1);
                      if (iVar2 == 0) {
                        retval = IDAQuadInit(returnvalue_00,rhsQ,returnvalue);
                        iVar3 = 1;
                        iVar2 = check_retval(&retval,"IDAQuadInit",1);
                        if (iVar2 == 0) {
                          retval = IDAQuadSStolerances(0xd9d7bdbb,0x812dea11,returnvalue_00);
                          iVar3 = 1;
                          iVar2 = check_retval(&retval,"IDAQuadSStolerances",1);
                          if (iVar2 == 0) {
                            iVar3 = 1;
                            retval = IDASetQuadErrCon(returnvalue_00,1);
                            iVar2 = check_retval(&retval,"IDASetQuadErrCon",1);
                            if (iVar2 == 0) {
                              puts(
                                  "\nidasAkzoNob_dns: Akzo Nobel chemical kinetics DAE serial example problem for IDAS"
                                  );
                              puts("Linear solver: DENSE, Jacobian is computed by IDAS.");
                              printf("Tolerance parameters:  rtol = %g   atol = %g\n",0xe2308c3a,
                                     0xd9d7bdbb);
                              puts(
                                  "---------------------------------------------------------------------------------"
                                  );
                              printf("   t        y1        y2       y3       y4       y5");
                              puts("      y6    | nst  k      h");
                              puts(
                                  "---------------------------------------------------------------------------------"
                                  );
                              PrintOutput(returnvalue_00,0.0,yy);
                              local_84 = 0x1a;
                              do {
                                retval = IDASolve(SUB84(local_90,0),returnvalue_00,&time,yy,yd,1);
                                iVar2 = check_retval(&retval,"IDASolve",1);
                                if (iVar2 != 0) {
                                  return 1;
                                }
                                PrintOutput(returnvalue_00,time,yy);
                                local_90 = local_90 * 2.57164431035691;
                                local_84 = local_84 + -1;
                              } while (local_84 != 0);
                              retval = IDAGetQuad(returnvalue_00,&time,returnvalue);
                              iVar3 = 1;
                              iVar2 = check_retval(&retval,"IDAGetQuad",1);
                              if (iVar2 == 0) {
                                puts("\n--------------------------------------------------------");
                                printf("G:          %24.16f \n",
                                       (int)**(undefined8 **)(*returnvalue + 0x10));
                                puts("--------------------------------------------------------\n");
                                IDAGetNumSteps(returnvalue_00,&nst);
                                IDAGetNumResEvals(returnvalue_00,&nre);
                                IDAGetNumJacEvals(returnvalue_00,&nje);
                                IDAGetNumNonlinSolvIters(returnvalue_00,&nni);
                                IDAGetNumErrTestFails(returnvalue_00,&netf);
                                IDAGetNumNonlinSolvConvFails(returnvalue_00,&ncfn);
                                iVar2 = IDAGetNumLinResEvals(returnvalue_00,&nreLS);
                                puts("\nFinal Run Statistics: \n");
                                printf("Number of steps                    = %ld\n",nst);
                                printf("Number of residual evaluations     = %ld\n",nreLS + nre);
                                printf("Number of Jacobian evaluations     = %ld\n",nje);
                                printf("Number of nonlinear iterations     = %ld\n",nni);
                                printf("Number of error test failures      = %ld\n",netf);
                                printf("Number of nonlinear conv. failures = %ld\n",ncfn);
                                iVar3 = 1;
                                retval = iVar2;
                                iVar2 = check_retval(&retval,"PrintFinalStats",1);
                                if (iVar2 == 0) {
                                  IDAFree(&local_70);
                                  SUNLinSolFree(local_80);
                                  SUNMatDestroy(local_98);
                                  N_VDestroy(yy);
                                  N_VDestroy(yd);
                                  N_VDestroy(returnvalue);
                                  free(userdata);
                                  SUNContext_Free(&ctx);
                                  iVar3 = 0;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int main(void)
{
  UserData data;
  void* mem;
  N_Vector yy, yp, rr, q;
  int retval;
  sunrealtype time, tout, incr;
  int nout;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  /* Consistent IC for  y, y'. */
  const sunrealtype y01 = SUN_RCONST(0.444);
  const sunrealtype y02 = SUN_RCONST(0.00123);
  const sunrealtype y03 = SUN_RCONST(0.0);
  const sunrealtype y04 = SUN_RCONST(0.007);
  const sunrealtype y05 = SUN_RCONST(0.0);

  mem = NULL;
  yy = yp = NULL;
  A       = NULL;
  LS      = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate user data. */
  data = (UserData)malloc(sizeof(*data));

  /* Fill user's data with the appropriate values for coefficients. */
  data->k1   = SUN_RCONST(18.7);
  data->k2   = SUN_RCONST(0.58);
  data->k3   = SUN_RCONST(0.09);
  data->k4   = SUN_RCONST(0.42);
  data->K    = SUN_RCONST(34.4);
  data->klA  = SUN_RCONST(3.3);
  data->Ks   = SUN_RCONST(115.83);
  data->pCO2 = SUN_RCONST(0.9);
  data->H    = SUN_RCONST(737.0);

  /* Allocate N-vectors. */
  yy = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (1); }
  yp = N_VClone(yy);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }

  /* Set IC */
  Ith(yy, 1) = y01;
  Ith(yy, 2) = y02;
  Ith(yy, 3) = y03;
  Ith(yy, 4) = y04;
  Ith(yy, 5) = y05;
  Ith(yy, 6) = data->Ks * y01 * y04;

  /* Get y' = - res(t0, y, 0) */
  N_VConst(ZERO, yp);

  rr = N_VClone(yy);
  res(T0, yy, yp, rr, data);
  N_VScale(-ONE, rr, yp);
  N_VDestroy(rr);

  /* Create and initialize q0 for quadratures. */
  q = N_VNew_Serial(1, ctx);
  if (check_retval((void*)q, "N_VNew_Serial", 0)) { return (1); }
  Ith(q, 1) = ZERO;

  /* Call IDACreate and IDAInit to initialize IDA memory */
  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDAInit(mem, res, T0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Set tolerances. */
  retval = IDASStolerances(mem, RTOL, ATOL);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Attach user data. */
  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Initialize QUADRATURE(S). */
  retval = IDAQuadInit(mem, rhsQ, q);
  if (check_retval(&retval, "IDAQuadInit", 1)) { return (1); }

  /* Set tolerances and error control for quadratures. */
  retval = IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  if (check_retval(&retval, "IDAQuadSStolerances", 1)) { return (1); }

  retval = IDASetQuadErrCon(mem, SUNTRUE);
  if (check_retval(&retval, "IDASetQuadErrCon", 1)) { return (1); }

  PrintHeader(RTOL, ATOL, yy);
  /* Print initial states */
  PrintOutput(mem, 0.0, yy);

  tout = T1;
  nout = 0;
  incr = SUNRpowerR(TF / T1, ONE / NF);

  /* FORWARD run. */
  while (1)
  {
    retval = IDASolve(mem, tout, &time, yy, yp, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }

    PrintOutput(mem, time, yy);

    nout++;
    tout *= incr;

    if (nout > NF) { break; }
  }

  retval = IDAGetQuad(mem, &time, q);
  if (check_retval(&retval, "IDAGetQuad", 1)) { return (1); }

  printf("\n--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:          %24.16Lf \n", Ith(q, 1));
#else
  printf("G:          %24.16f \n", Ith(q, 1));
#endif
  printf("--------------------------------------------------------\n\n");

  retval = PrintFinalStats(mem);
  if (check_retval(&retval, "PrintFinalStats", 1)) { return (1); }

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(q);
  free(data);
  SUNContext_Free(&ctx);

  return (0);
}